

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O2

sexp sexp_char_ready_p(sexp ctx,sexp self,sexp_sint_t n,sexp in)

{
  sexp __stream;
  uint uVar1;
  int iVar2;
  int iVar3;
  sexp psVar4;
  sexp psVar5;
  pollfd local_30;
  
  if ((((ulong)in & 3) != 0) || (in->tag != 0x10)) {
    psVar4 = sexp_type_exception(ctx,self,0x10,in);
    return psVar4;
  }
  psVar4 = (sexp)&DAT_0000003e;
  if ((in->value).flonum_bits[0x28] != '\0') {
    if ((in->value).type.setters == (sexp)0x0) {
      psVar5 = (in->value).type.slots;
    }
    else {
      if ((in->value).type.print < (sexp)(in->value).port.size) {
        return (sexp)&DAT_0000013e;
      }
      psVar5 = (in->value).type.slots;
      if (((((ulong)psVar5 & 3) != 0) || (psVar5->tag != 0x12)) &&
         ((in->value).type.getters == (sexp)0x0)) {
        return (sexp)&DAT_0000013e;
      }
    }
    if ((((ulong)psVar5 & 3) == 0) && (psVar5->tag == 0x12)) {
      __stream = (in->value).type.getters;
      if (__stream == (sexp)0x0) {
        local_30.fd = (psVar5->value).promise.donep;
      }
      else {
        local_30.fd = fileno((FILE *)__stream);
      }
      if (-1 < local_30.fd) {
        local_30.events = 1;
        iVar3 = poll(&local_30,1,0);
        if (iVar3 == 1) {
          psVar4 = (sexp)&DAT_0000013e;
        }
      }
    }
    else {
      psVar5 = (in->value).type.getters;
      psVar4 = (sexp)&DAT_0000013e;
      if (psVar5 != (sexp)0x0) {
        iVar3 = fileno((FILE *)psVar5);
        uVar1 = fcntl(iVar3,3);
        if ((uVar1 >> 0xb & 1) == 0) {
          iVar3 = fileno((FILE *)psVar5);
          fcntl(iVar3,4,0);
        }
        iVar3 = getc((FILE *)psVar5);
        if ((uVar1 >> 0xb & 1) == 0) {
          iVar2 = fileno((FILE *)psVar5);
          fcntl(iVar2,4,(ulong)uVar1);
        }
        if ((iVar3 == -1) || (iVar2 = ferror((FILE *)psVar5), iVar2 != 0)) {
          clearerr((FILE *)psVar5);
          psVar4 = (sexp)&DAT_0000003e;
        }
        else {
          ungetc(iVar3,(FILE *)psVar5);
        }
      }
    }
  }
  return psVar4;
}

Assistant:

sexp sexp_char_ready_p (sexp ctx, sexp self, sexp_sint_t n, sexp in) {
  sexp_assert_type(ctx, sexp_iportp, SEXP_IPORT, in);
  if (!sexp_port_openp(in))
    return SEXP_FALSE;
  if (sexp_port_buf(in))
    if (sexp_port_offset(in) < sexp_port_size(in)
        || (!sexp_filenop(sexp_port_fd(in)) && !sexp_port_stream(in)))
      return SEXP_TRUE;
#if SEXP_USE_GREEN_THREADS     /* maybe not just when threads are enabled */
  if (sexp_filenop(sexp_port_fd(in)))
    return sexp_make_boolean(sexp_fileno_ready_p(sexp_port_fileno(in)));
  else if (sexp_port_stream(in))
    return sexp_make_boolean(sexp_stream_ready_p(sexp_port_stream(in)));
#endif
  /* for custom ports and unthreaded compiles we just return true for now */
  return SEXP_TRUE;
}